

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-util.cc
# Opt level: O2

void wabt::interp::WriteValue(Stream *stream,TypedValue *tv)

{
  TypedValue *in_RDX;
  string s;
  string local_30;
  
  TypedValueToString_abi_cxx11_(&local_30,(interp *)tv,in_RDX);
  Stream::WriteData(stream,local_30._M_dataplus._M_p,local_30._M_string_length,(char *)0x0,No);
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void WriteValue(Stream* stream, const TypedValue& tv) {
  std::string s = TypedValueToString(tv);
  stream->WriteData(s.data(), s.size());
}